

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simulation.cpp
# Opt level: O0

void __thiscall Simulation::run(Simulation *this)

{
  bool bVar1;
  Field<double,_unsigned_short> *F;
  rep dt_00;
  duration<long,_std::ratio<1L,_1000000000L>_> local_40;
  duration<float,_std::ratio<1L,_1L>_> local_34;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_30;
  time_point stopTime;
  time_point startTime;
  uint64_t it;
  float dt;
  Simulation *this_local;
  
  startTime.__d.__r = (duration)0;
  printStatus(this,0,0.0);
  for (; bVar1 = Window::windowShouldClose(&this->_window),
      !bVar1 && (ulong)startTime.__d.__r < (ulong)Config::endFrame.__r;
      startTime.__d.__r = (duration)((long)startTime.__d.__r + 1)) {
    stopTime.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    stepFluid(this,(uint64_t)startTime.__d.__r);
    if ((Config::renderFrames & 1) != 0) {
      renderFrame(this);
    }
    if (Config::dim == 2) {
      Renderer::writeImg(&this->_renderer,(uint32_t)startTime.__d.__r);
    }
    else if (Config::dim == 3) {
      if ((Config::exportFrames & 1) != 0) {
        Renderer::writeImg(&this->_renderer,(uint32_t)startTime.__d.__r);
      }
      F = Fluids::surface(&this->_fluid);
      MarchingCube::run((MarchingCube *)&this->field_0x68,F,(uint64_t)startTime.__d.__r);
    }
    local_30.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    local_40.__r = (rep_conflict)std::chrono::operator-(&local_30,&stopTime);
    std::chrono::duration<float,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
              ((duration<float,std::ratio<1l,1l>> *)&local_34,&local_40);
    dt_00 = std::chrono::duration<float,_std::ratio<1L,_1L>_>::count(&local_34);
    printStatus(this,(uint64_t)startTime.__d.__r,dt_00);
  }
  Renderer::freeMesh(&this->_renderer,&(this->_fluidRenderer).mesh);
  Renderer::freeMesh(&this->_renderer,&(this->_fluidRenderer).meshGrid);
  Renderer::freeMesh(&this->_renderer,&(this->_fluidRenderer).meshGridBorder);
  Renderer::freeMesh(&this->_renderer,&(this->_fluidRenderer).meshVec);
  return;
}

Assistant:

void Simulation::run()
{
    float dt = 0.0f;
    std::uint64_t it = 0;
    printStatus(it, dt);
    while (!_window.windowShouldClose() && it < Config::endFrame)
    {
        auto startTime = std::chrono::high_resolution_clock::now();

        // Simulation update in the step-time
        stepFluid(it);

        // Simulation rendering
        if (Config::renderFrames)
        {
            renderFrame();
        }

        // Simulation results export
        // in either .png or .ply depending on the grid dimension
        switch (Config::dim)
        {
            case 2:
                _renderer.writeImg(it);
                break;
            case 3:
                if (Config::exportFrames)
                {
                    _renderer.writeImg(it);
                }
                marchingCube.run(_fluid.surface(), it);
                break;
        }

        auto stopTime = std::chrono::high_resolution_clock::now();
        dt = std::chrono::duration<float, std::chrono::seconds::period>(
                stopTime - startTime).count();
        printStatus(it, dt);

        it++;
    }

    // Clean meshes
    _renderer.freeMesh(_fluidRenderer.mesh);
    _renderer.freeMesh(_fluidRenderer.meshGrid);
    _renderer.freeMesh(_fluidRenderer.meshGridBorder);
    _renderer.freeMesh(_fluidRenderer.meshVec);
}